

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::
dispatch<true,TI::TMS::RefreshSequencer<(TI::TMS::Personality)3>>
          (Base<(TI::TMS::Personality)3> *this,RefreshSequencer<(TI::TMS::Personality)3> *fetcher,
          int start,int end)

{
  switch(start) {
  case 0:
    do_external_slot(fetcher->base,0);
    if (end == 1) {
      return;
    }
  case 1:
    do_external_slot(fetcher->base,2);
    if (end == 2) {
      return;
    }
switchD_001a3db0_caseD_2:
    do_external_slot(fetcher->base,4);
    if (end == 3) {
      return;
    }
switchD_001a3db0_caseD_3:
    do_external_slot(fetcher->base,6);
    if (end == 4) {
      return;
    }
switchD_001a3db0_caseD_4:
    do_external_slot(fetcher->base,8);
    if (end == 5) {
      return;
    }
switchD_001a3db0_caseD_5:
    do_external_slot(fetcher->base,10);
    if (end == 6) {
      return;
    }
switchD_001a3db0_caseD_6:
    do_external_slot(fetcher->base,0xc);
    if (end == 7) {
      return;
    }
switchD_001a3db0_caseD_7:
    do_external_slot(fetcher->base,0xe);
    if (end == 8) {
      return;
    }
switchD_001a3db0_caseD_8:
    do_external_slot(fetcher->base,0x10);
    if (end == 9) {
      return;
    }
switchD_001a3db0_caseD_9:
    do_external_slot(fetcher->base,0x12);
    if (end == 10) {
      return;
    }
switchD_001a3db0_caseD_a:
    do_external_slot(fetcher->base,0x14);
    if (end == 0xb) {
      return;
    }
switchD_001a3db0_caseD_b:
    do_external_slot(fetcher->base,0x16);
    if (end == 0xc) {
      return;
    }
switchD_001a3db0_caseD_c:
    do_external_slot(fetcher->base,0x18);
    if (end == 0xd) {
      return;
    }
switchD_001a3db0_caseD_d:
    do_external_slot(fetcher->base,0x1a);
    if (end == 0xe) {
      return;
    }
switchD_001a3db0_caseD_e:
    do_external_slot(fetcher->base,0x1c);
    if (end == 0xf) {
      return;
    }
switchD_001a3db0_caseD_f:
    do_external_slot(fetcher->base,0x1e);
    if (end == 0x10) {
      return;
    }
switchD_001a3db0_caseD_10:
    do_external_slot(fetcher->base,0x20);
    if (end == 0x11) {
      return;
    }
switchD_001a3db0_caseD_11:
    do_external_slot(fetcher->base,0x22);
    if (end == 0x12) {
      return;
    }
switchD_001a3db0_caseD_12:
    do_external_slot(fetcher->base,0x24);
    if (end == 0x13) {
      return;
    }
switchD_001a3db0_caseD_13:
    do_external_slot(fetcher->base,0x26);
    if (end == 0x14) {
      return;
    }
switchD_001a3db0_caseD_14:
    do_external_slot(fetcher->base,0x28);
    if (end == 0x15) {
      return;
    }
switchD_001a3db0_caseD_15:
    do_external_slot(fetcher->base,0x2a);
    if (end == 0x16) {
      return;
    }
switchD_001a3db0_caseD_16:
    do_external_slot(fetcher->base,0x2c);
    if (end == 0x17) {
      return;
    }
switchD_001a3db0_caseD_17:
    do_external_slot(fetcher->base,0x2e);
    if (end == 0x18) {
      return;
    }
switchD_001a3db0_caseD_18:
    do_external_slot(fetcher->base,0x30);
    if (end == 0x19) {
      return;
    }
switchD_001a3db0_caseD_19:
    do_external_slot(fetcher->base,0x32);
    if ((end & 0xfffffffeU) == 0x1a) {
      return;
    }
    break;
  case 2:
    goto switchD_001a3db0_caseD_2;
  case 3:
    goto switchD_001a3db0_caseD_3;
  case 4:
    goto switchD_001a3db0_caseD_4;
  case 5:
    goto switchD_001a3db0_caseD_5;
  case 6:
    goto switchD_001a3db0_caseD_6;
  case 7:
    goto switchD_001a3db0_caseD_7;
  case 8:
    goto switchD_001a3db0_caseD_8;
  case 9:
    goto switchD_001a3db0_caseD_9;
  case 10:
    goto switchD_001a3db0_caseD_a;
  case 0xb:
    goto switchD_001a3db0_caseD_b;
  case 0xc:
    goto switchD_001a3db0_caseD_c;
  case 0xd:
    goto switchD_001a3db0_caseD_d;
  case 0xe:
    goto switchD_001a3db0_caseD_e;
  case 0xf:
    goto switchD_001a3db0_caseD_f;
  case 0x10:
    goto switchD_001a3db0_caseD_10;
  case 0x11:
    goto switchD_001a3db0_caseD_11;
  case 0x12:
    goto switchD_001a3db0_caseD_12;
  case 0x13:
    goto switchD_001a3db0_caseD_13;
  case 0x14:
    goto switchD_001a3db0_caseD_14;
  case 0x15:
    goto switchD_001a3db0_caseD_15;
  case 0x16:
    goto switchD_001a3db0_caseD_16;
  case 0x17:
    goto switchD_001a3db0_caseD_17;
  case 0x18:
    goto switchD_001a3db0_caseD_18;
  case 0x19:
    goto switchD_001a3db0_caseD_19;
  case 0x1a:
    if (end == 0x1b) {
      return;
    }
    break;
  case 0x1b:
    break;
  case 0x1c:
    if (end == 0x1d) {
      return;
    }
  case 0x1d:
    goto switchD_001a3db0_caseD_1d;
  case 0x1e:
    if (end == 0x1f) {
      return;
    }
  case 0x1f:
    goto switchD_001a3db0_caseD_1f;
  case 0x20:
    if (end == 0x21) {
      return;
    }
  case 0x21:
    goto switchD_001a3db0_caseD_21;
  case 0x22:
    if (end == 0x23) {
      return;
    }
  case 0x23:
    goto switchD_001a3db0_caseD_23;
  case 0x24:
    if (end == 0x25) {
      return;
    }
  case 0x25:
    goto switchD_001a3db0_caseD_25;
  case 0x26:
    if (end == 0x27) {
      return;
    }
  case 0x27:
    goto switchD_001a3db0_caseD_27;
  case 0x28:
    if (end == 0x29) {
      return;
    }
  case 0x29:
    goto switchD_001a3db0_caseD_29;
  case 0x2a:
    if (end == 0x2b) {
      return;
    }
  case 0x2b:
    goto switchD_001a3db0_caseD_2b;
  case 0x2c:
    if (end == 0x2d) {
      return;
    }
  case 0x2d:
    goto switchD_001a3db0_caseD_2d;
  case 0x2e:
    if (end == 0x2f) {
      return;
    }
  case 0x2f:
    goto switchD_001a3db0_caseD_2f;
  case 0x30:
    if (end == 0x31) {
      return;
    }
  case 0x31:
    goto switchD_001a3db0_caseD_31;
  case 0x32:
    if (end == 0x33) {
      return;
    }
  case 0x33:
    goto switchD_001a3db0_caseD_33;
  case 0x34:
    if (end == 0x35) {
      return;
    }
  case 0x35:
    goto switchD_001a3db0_caseD_35;
  case 0x36:
    if (end == 0x37) {
      return;
    }
  case 0x37:
    goto switchD_001a3db0_caseD_37;
  case 0x38:
    if (end == 0x39) {
      return;
    }
  case 0x39:
    goto switchD_001a3db0_caseD_39;
  case 0x3a:
    if (end == 0x3b) {
      return;
    }
  case 0x3b:
    goto switchD_001a3db0_caseD_3b;
  case 0x3c:
    if (end == 0x3d) {
      return;
    }
  case 0x3d:
    goto switchD_001a3db0_caseD_3d;
  case 0x3e:
    if (end == 0x3f) {
      return;
    }
  case 0x3f:
    goto switchD_001a3db0_caseD_3f;
  case 0x40:
    if (end == 0x41) {
      return;
    }
  case 0x41:
    goto switchD_001a3db0_caseD_41;
  case 0x42:
    if (end == 0x43) {
      return;
    }
  case 0x43:
    goto switchD_001a3db0_caseD_43;
  case 0x44:
    if (end == 0x45) {
      return;
    }
  case 0x45:
    goto switchD_001a3db0_caseD_45;
  case 0x46:
    if (end == 0x47) {
      return;
    }
  case 0x47:
    goto switchD_001a3db0_caseD_47;
  case 0x48:
    if (end == 0x49) {
      return;
    }
  case 0x49:
    goto switchD_001a3db0_caseD_49;
  case 0x4a:
    if (end == 0x4b) {
      return;
    }
  case 0x4b:
    goto switchD_001a3db0_caseD_4b;
  case 0x4c:
    if (end == 0x4d) {
      return;
    }
  case 0x4d:
    goto switchD_001a3db0_caseD_4d;
  case 0x4e:
    if (end == 0x4f) {
      return;
    }
  case 0x4f:
    goto switchD_001a3db0_caseD_4f;
  case 0x50:
    if (end == 0x51) {
      return;
    }
  case 0x51:
    goto switchD_001a3db0_caseD_51;
  case 0x52:
    if (end == 0x53) {
      return;
    }
  case 0x53:
    goto switchD_001a3db0_caseD_53;
  case 0x54:
    if (end == 0x55) {
      return;
    }
  case 0x55:
    goto switchD_001a3db0_caseD_55;
  case 0x56:
    if (end == 0x57) {
      return;
    }
  case 0x57:
    goto switchD_001a3db0_caseD_57;
  case 0x58:
    if (end == 0x59) {
      return;
    }
  case 0x59:
    goto switchD_001a3db0_caseD_59;
  case 0x5a:
    if (end == 0x5b) {
      return;
    }
  case 0x5b:
    goto switchD_001a3db0_caseD_5b;
  case 0x5c:
    if (end == 0x5d) {
      return;
    }
  case 0x5d:
    goto switchD_001a3db0_caseD_5d;
  case 0x5e:
    if (end == 0x5f) {
      return;
    }
  case 0x5f:
    goto switchD_001a3db0_caseD_5f;
  case 0x60:
    if (end == 0x61) {
      return;
    }
  case 0x61:
    goto switchD_001a3db0_caseD_61;
  case 0x62:
    if (end == 99) {
      return;
    }
  case 99:
    goto switchD_001a3db0_caseD_63;
  case 100:
    if (end == 0x65) {
      return;
    }
  case 0x65:
    goto switchD_001a3db0_caseD_65;
  case 0x66:
    if (end == 0x67) {
      return;
    }
  case 0x67:
    goto switchD_001a3db0_caseD_67;
  case 0x68:
    if (end == 0x69) {
      return;
    }
  case 0x69:
    goto switchD_001a3db0_caseD_69;
  case 0x6a:
    if (end == 0x6b) {
      return;
    }
  case 0x6b:
    goto switchD_001a3db0_caseD_6b;
  case 0x6c:
    if (end == 0x6d) {
      return;
    }
  case 0x6d:
    goto switchD_001a3db0_caseD_6d;
  case 0x6e:
    if (end == 0x6f) {
      return;
    }
  case 0x6f:
    goto switchD_001a3db0_caseD_6f;
  case 0x70:
    if (end == 0x71) {
      return;
    }
  case 0x71:
    goto switchD_001a3db0_caseD_71;
  case 0x72:
    if (end == 0x73) {
      return;
    }
  case 0x73:
    goto switchD_001a3db0_caseD_73;
  case 0x74:
    if (end == 0x75) {
      return;
    }
  case 0x75:
    goto switchD_001a3db0_caseD_75;
  case 0x76:
    if (end == 0x77) {
      return;
    }
  case 0x77:
    goto switchD_001a3db0_caseD_77;
  case 0x78:
    if (end == 0x79) {
      return;
    }
  case 0x79:
    goto switchD_001a3db0_caseD_79;
  case 0x7a:
    if (end == 0x7b) {
      return;
    }
  case 0x7b:
    goto switchD_001a3db0_caseD_7b;
  case 0x7c:
    if (end == 0x7d) {
      return;
    }
  case 0x7d:
    goto switchD_001a3db0_caseD_7d;
  case 0x7e:
    if (end == 0x7f) {
      return;
    }
  case 0x7f:
    goto switchD_001a3db0_caseD_7f;
  case 0x80:
    if (end == 0x81) {
      return;
    }
  case 0x81:
    goto switchD_001a3db0_caseD_81;
  case 0x82:
    if (end == 0x83) {
      return;
    }
  case 0x83:
    goto switchD_001a3db0_caseD_83;
  case 0x84:
    if (end == 0x85) {
      return;
    }
  case 0x85:
    goto switchD_001a3db0_caseD_85;
  case 0x86:
    if (end == 0x87) {
      return;
    }
  case 0x87:
    goto switchD_001a3db0_caseD_87;
  case 0x88:
    if (end == 0x89) {
      return;
    }
  case 0x89:
    goto switchD_001a3db0_caseD_89;
  case 0x8a:
    if (end == 0x8b) {
      return;
    }
  case 0x8b:
    goto switchD_001a3db0_caseD_8b;
  case 0x8c:
    if (end == 0x8d) {
      return;
    }
  case 0x8d:
    goto switchD_001a3db0_caseD_8d;
  case 0x8e:
    if (end == 0x8f) {
      return;
    }
  case 0x8f:
    goto switchD_001a3db0_caseD_8f;
  case 0x90:
    if (end == 0x91) {
      return;
    }
  case 0x91:
    goto switchD_001a3db0_caseD_91;
  case 0x92:
    if (end == 0x93) {
      return;
    }
  case 0x93:
    goto switchD_001a3db0_caseD_93;
  case 0x94:
    if (end == 0x95) {
      return;
    }
  case 0x95:
    goto switchD_001a3db0_caseD_95;
  case 0x96:
    if (end == 0x97) {
      return;
    }
  case 0x97:
    goto switchD_001a3db0_caseD_97;
  case 0x98:
    if (end == 0x99) {
      return;
    }
  case 0x99:
    goto switchD_001a3db0_caseD_99;
  case 0x9a:
    goto switchD_001a3db0_caseD_9a;
  case 0x9b:
    goto switchD_001a3db0_caseD_9b;
  case 0x9c:
    goto switchD_001a3db0_caseD_9c;
  case 0x9d:
    goto switchD_001a3db0_caseD_9d;
  case 0x9e:
    goto switchD_001a3db0_caseD_9e;
  case 0x9f:
    goto switchD_001a3db0_caseD_9f;
  case 0xa0:
    goto switchD_001a3db0_caseD_a0;
  case 0xa1:
    goto switchD_001a3db0_caseD_a1;
  case 0xa2:
    goto switchD_001a3db0_caseD_a2;
  case 0xa3:
    goto switchD_001a3db0_caseD_a3;
  case 0xa4:
    goto switchD_001a3db0_caseD_a4;
  case 0xa5:
    goto switchD_001a3db0_caseD_a5;
  case 0xa6:
    goto switchD_001a3db0_caseD_a6;
  case 0xa7:
    goto switchD_001a3db0_caseD_a7;
  case 0xa8:
    goto switchD_001a3db0_caseD_a8;
  case 0xa9:
    goto switchD_001a3db0_caseD_a9;
  case 0xaa:
    goto switchD_001a3db0_caseD_aa;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Components/9918/Implementation/../Implementation/Fetch.hpp"
                  ,0x3b,
                  "void TI::TMS::Base<TI::TMS::SMSVDP>::dispatch(SequencerT &, int, int) [personality = TI::TMS::SMSVDP, use_end = true, Fetcher = TI::TMS::RefreshSequencer<TI::TMS::SMSVDP>]"
                 );
  }
  do_external_slot(fetcher->base,0x36);
  if ((end & 0xfffffffeU) != 0x1c) {
switchD_001a3db0_caseD_1d:
    do_external_slot(fetcher->base,0x3a);
    if ((end & 0xfffffffeU) != 0x1e) {
switchD_001a3db0_caseD_1f:
      do_external_slot(fetcher->base,0x3e);
      if ((end & 0xfffffffeU) != 0x20) {
switchD_001a3db0_caseD_21:
        do_external_slot(fetcher->base,0x42);
        if ((end & 0xfffffffeU) != 0x22) {
switchD_001a3db0_caseD_23:
          do_external_slot(fetcher->base,0x46);
          if ((end & 0xfffffffeU) != 0x24) {
switchD_001a3db0_caseD_25:
            do_external_slot(fetcher->base,0x4a);
            if ((end & 0xfffffffeU) != 0x26) {
switchD_001a3db0_caseD_27:
              do_external_slot(fetcher->base,0x4e);
              if ((end & 0xfffffffeU) != 0x28) {
switchD_001a3db0_caseD_29:
                do_external_slot(fetcher->base,0x52);
                if ((end & 0xfffffffeU) != 0x2a) {
switchD_001a3db0_caseD_2b:
                  do_external_slot(fetcher->base,0x56);
                  if ((end & 0xfffffffeU) != 0x2c) {
switchD_001a3db0_caseD_2d:
                    do_external_slot(fetcher->base,0x5a);
                    if ((end & 0xfffffffeU) != 0x2e) {
switchD_001a3db0_caseD_2f:
                      do_external_slot(fetcher->base,0x5e);
                      if ((end & 0xfffffffeU) != 0x30) {
switchD_001a3db0_caseD_31:
                        do_external_slot(fetcher->base,0x62);
                        if ((end & 0xfffffffeU) != 0x32) {
switchD_001a3db0_caseD_33:
                          do_external_slot(fetcher->base,0x66);
                          if ((end & 0xfffffffeU) != 0x34) {
switchD_001a3db0_caseD_35:
                            do_external_slot(fetcher->base,0x6a);
                            if ((end & 0xfffffffeU) != 0x36) {
switchD_001a3db0_caseD_37:
                              do_external_slot(fetcher->base,0x6e);
                              if ((end & 0xfffffffeU) != 0x38) {
switchD_001a3db0_caseD_39:
                                do_external_slot(fetcher->base,0x72);
                                if ((end & 0xfffffffeU) != 0x3a) {
switchD_001a3db0_caseD_3b:
                                  do_external_slot(fetcher->base,0x76);
                                  if ((end & 0xfffffffeU) != 0x3c) {
switchD_001a3db0_caseD_3d:
                                    do_external_slot(fetcher->base,0x7a);
                                    if ((end & 0xfffffffeU) != 0x3e) {
switchD_001a3db0_caseD_3f:
                                      do_external_slot(fetcher->base,0x7e);
                                      if ((end & 0xfffffffeU) != 0x40) {
switchD_001a3db0_caseD_41:
                                        do_external_slot(fetcher->base,0x82);
                                        if ((end & 0xfffffffeU) != 0x42) {
switchD_001a3db0_caseD_43:
                                          do_external_slot(fetcher->base,0x86);
                                          if ((end & 0xfffffffeU) != 0x44) {
switchD_001a3db0_caseD_45:
                                            do_external_slot(fetcher->base,0x8a);
                                            if ((end & 0xfffffffeU) != 0x46) {
switchD_001a3db0_caseD_47:
                                              do_external_slot(fetcher->base,0x8e);
                                              if ((end & 0xfffffffeU) != 0x48) {
switchD_001a3db0_caseD_49:
                                                do_external_slot(fetcher->base,0x92);
                                                if ((end & 0xfffffffeU) != 0x4a) {
switchD_001a3db0_caseD_4b:
                                                  do_external_slot(fetcher->base,0x96);
                                                  if ((end & 0xfffffffeU) != 0x4c) {
switchD_001a3db0_caseD_4d:
                                                    do_external_slot(fetcher->base,0x9a);
                                                    if ((end & 0xfffffffeU) != 0x4e) {
switchD_001a3db0_caseD_4f:
                                                      do_external_slot(fetcher->base,0x9e);
                                                      if ((end & 0xfffffffeU) != 0x50) {
switchD_001a3db0_caseD_51:
                                                        do_external_slot(fetcher->base,0xa2);
                                                        if ((end & 0xfffffffeU) != 0x52) {
switchD_001a3db0_caseD_53:
                                                          do_external_slot(fetcher->base,0xa6);
                                                          if ((end & 0xfffffffeU) != 0x54) {
switchD_001a3db0_caseD_55:
                                                            do_external_slot(fetcher->base,0xaa);
                                                            if ((end & 0xfffffffeU) != 0x56) {
switchD_001a3db0_caseD_57:
                                                              do_external_slot(fetcher->base,0xae);
                                                              if ((end & 0xfffffffeU) != 0x58) {
switchD_001a3db0_caseD_59:
                                                                do_external_slot(fetcher->base,0xb2)
                                                                ;
                                                                if ((end & 0xfffffffeU) != 0x5a) {
switchD_001a3db0_caseD_5b:
                                                                  do_external_slot(fetcher->base,
                                                                                   0xb6);
                                                                  if ((end & 0xfffffffeU) != 0x5c) {
switchD_001a3db0_caseD_5d:
                                                                    do_external_slot(fetcher->base,
                                                                                     0xba);
                                                                    if ((end & 0xfffffffeU) != 0x5e)
                                                                    {
switchD_001a3db0_caseD_5f:
                                                                      do_external_slot(fetcher->base
                                                                                       ,0xbe);
                                                                      if ((end & 0xfffffffeU) !=
                                                                          0x60) {
switchD_001a3db0_caseD_61:
                                                                        do_external_slot(fetcher->
                                                  base,0xc2);
                                                  if ((end & 0xfffffffeU) != 0x62) {
switchD_001a3db0_caseD_63:
                                                    do_external_slot(fetcher->base,0xc6);
                                                    if ((end & 0xfffffffeU) != 100) {
switchD_001a3db0_caseD_65:
                                                      do_external_slot(fetcher->base,0xca);
                                                      if ((end & 0xfffffffeU) != 0x66) {
switchD_001a3db0_caseD_67:
                                                        do_external_slot(fetcher->base,0xce);
                                                        if ((end & 0xfffffffeU) != 0x68) {
switchD_001a3db0_caseD_69:
                                                          do_external_slot(fetcher->base,0xd2);
                                                          if ((end & 0xfffffffeU) != 0x6a) {
switchD_001a3db0_caseD_6b:
                                                            do_external_slot(fetcher->base,0xd6);
                                                            if ((end & 0xfffffffeU) != 0x6c) {
switchD_001a3db0_caseD_6d:
                                                              do_external_slot(fetcher->base,0xda);
                                                              if ((end & 0xfffffffeU) != 0x6e) {
switchD_001a3db0_caseD_6f:
                                                                do_external_slot(fetcher->base,0xde)
                                                                ;
                                                                if ((end & 0xfffffffeU) != 0x70) {
switchD_001a3db0_caseD_71:
                                                                  do_external_slot(fetcher->base,
                                                                                   0xe2);
                                                                  if ((end & 0xfffffffeU) != 0x72) {
switchD_001a3db0_caseD_73:
                                                                    do_external_slot(fetcher->base,
                                                                                     0xe6);
                                                                    if ((end & 0xfffffffeU) != 0x74)
                                                                    {
switchD_001a3db0_caseD_75:
                                                                      do_external_slot(fetcher->base
                                                                                       ,0xea);
                                                                      if ((end & 0xfffffffeU) !=
                                                                          0x76) {
switchD_001a3db0_caseD_77:
                                                                        do_external_slot(fetcher->
                                                  base,0xee);
                                                  if ((end & 0xfffffffeU) != 0x78) {
switchD_001a3db0_caseD_79:
                                                    do_external_slot(fetcher->base,0xf2);
                                                    if ((end & 0xfffffffeU) != 0x7a) {
switchD_001a3db0_caseD_7b:
                                                      do_external_slot(fetcher->base,0xf6);
                                                      if ((end & 0xfffffffeU) != 0x7c) {
switchD_001a3db0_caseD_7d:
                                                        do_external_slot(fetcher->base,0xfa);
                                                        if ((end & 0xfffffffeU) != 0x7e) {
switchD_001a3db0_caseD_7f:
                                                          do_external_slot(fetcher->base,0xfe);
                                                          if ((end & 0xfffffffeU) != 0x80) {
switchD_001a3db0_caseD_81:
                                                            do_external_slot(fetcher->base,0x102);
                                                            if ((end & 0xfffffffeU) != 0x82) {
switchD_001a3db0_caseD_83:
                                                              do_external_slot(fetcher->base,0x106);
                                                              if ((end & 0xfffffffeU) != 0x84) {
switchD_001a3db0_caseD_85:
                                                                do_external_slot(fetcher->base,0x10a
                                                                                );
                                                                if ((end & 0xfffffffeU) != 0x86) {
switchD_001a3db0_caseD_87:
                                                                  do_external_slot(fetcher->base,
                                                                                   0x10e);
                                                                  if ((end & 0xfffffffeU) != 0x88) {
switchD_001a3db0_caseD_89:
                                                                    do_external_slot(fetcher->base,
                                                                                     0x112);
                                                                    if ((end & 0xfffffffeU) != 0x8a)
                                                                    {
switchD_001a3db0_caseD_8b:
                                                                      do_external_slot(fetcher->base
                                                                                       ,0x116);
                                                                      if ((end & 0xfffffffeU) !=
                                                                          0x8c) {
switchD_001a3db0_caseD_8d:
                                                                        do_external_slot(fetcher->
                                                  base,0x11a);
                                                  if ((end & 0xfffffffeU) != 0x8e) {
switchD_001a3db0_caseD_8f:
                                                    do_external_slot(fetcher->base,0x11e);
                                                    if ((end & 0xfffffffeU) != 0x90) {
switchD_001a3db0_caseD_91:
                                                      do_external_slot(fetcher->base,0x122);
                                                      if ((end & 0xfffffffeU) != 0x92) {
switchD_001a3db0_caseD_93:
                                                        do_external_slot(fetcher->base,0x126);
                                                        if ((end & 0xfffffffeU) != 0x94) {
switchD_001a3db0_caseD_95:
                                                          do_external_slot(fetcher->base,0x12a);
                                                          if ((end & 0xfffffffeU) != 0x96) {
switchD_001a3db0_caseD_97:
                                                            do_external_slot(fetcher->base,0x12e);
                                                            if ((end & 0xfffffffeU) != 0x98) {
switchD_001a3db0_caseD_99:
                                                              do_external_slot(fetcher->base,0x132);
                                                              if (end != 0x9a) {
switchD_001a3db0_caseD_9a:
                                                                do_external_slot(fetcher->base,0x134
                                                                                );
                                                                if (end != 0x9b) {
switchD_001a3db0_caseD_9b:
                                                                  do_external_slot(fetcher->base,
                                                                                   0x136);
                                                                  if (end != 0x9c) {
switchD_001a3db0_caseD_9c:
                                                                    do_external_slot(fetcher->base,
                                                                                     0x138);
                                                                    if (end != 0x9d) {
switchD_001a3db0_caseD_9d:
                                                                      do_external_slot(fetcher->base
                                                                                       ,0x13a);
                                                                      if (end != 0x9e) {
switchD_001a3db0_caseD_9e:
                                                                        do_external_slot(fetcher->
                                                  base,0x13c);
                                                  if (end != 0x9f) {
switchD_001a3db0_caseD_9f:
                                                    do_external_slot(fetcher->base,0x13e);
                                                    if (end != 0xa0) {
switchD_001a3db0_caseD_a0:
                                                      do_external_slot(fetcher->base,0x140);
                                                      if (end != 0xa1) {
switchD_001a3db0_caseD_a1:
                                                        do_external_slot(fetcher->base,0x142);
                                                        if (end != 0xa2) {
switchD_001a3db0_caseD_a2:
                                                          do_external_slot(fetcher->base,0x144);
                                                          if (end != 0xa3) {
switchD_001a3db0_caseD_a3:
                                                            do_external_slot(fetcher->base,0x146);
                                                            if (end != 0xa4) {
switchD_001a3db0_caseD_a4:
                                                              do_external_slot(fetcher->base,0x148);
                                                              if (end != 0xa5) {
switchD_001a3db0_caseD_a5:
                                                                do_external_slot(fetcher->base,0x14a
                                                                                );
                                                                if (end != 0xa6) {
switchD_001a3db0_caseD_a6:
                                                                  do_external_slot(fetcher->base,
                                                                                   0x14c);
                                                                  if (end != 0xa7) {
switchD_001a3db0_caseD_a7:
                                                                    do_external_slot(fetcher->base,
                                                                                     0x14e);
                                                                    if (end != 0xa8) {
switchD_001a3db0_caseD_a8:
                                                                      do_external_slot(fetcher->base
                                                                                       ,0x150);
                                                                      if (end != 0xa9) {
switchD_001a3db0_caseD_a9:
                                                                        do_external_slot(fetcher->
                                                  base,0x152);
                                                  if (end != 0xaa) {
switchD_001a3db0_caseD_aa:
                                                    do_external_slot(fetcher->base,0x154);
                                                    return;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Base<personality>::dispatch(SequencerT &fetcher, int start, int end) {
#define index(n)						\
	if(use_end && end == n) return;		\
	[[fallthrough]];					\
	case n: fetcher.template fetch<from_internal<personality, Clock::FromStartOfSync>(n)>();

	switch(start) {
		default: assert(false);
		index(0);	index(1);	index(2);	index(3);	index(4);	index(5);	index(6);	index(7);	index(8);	index(9);
		index(10);	index(11);	index(12);	index(13);	index(14);	index(15);	index(16);	index(17);	index(18);	index(19);
		index(20);	index(21);	index(22);	index(23);	index(24);	index(25);	index(26);	index(27);	index(28);	index(29);
		index(30);	index(31);	index(32);	index(33);	index(34);	index(35);	index(36);	index(37);	index(38);	index(39);
		index(40);	index(41);	index(42);	index(43);	index(44);	index(45);	index(46);	index(47);	index(48);	index(49);
		index(50);	index(51);	index(52);	index(53);	index(54);	index(55);	index(56);	index(57);	index(58);	index(59);
		index(60);	index(61);	index(62);	index(63);	index(64);	index(65);	index(66);	index(67);	index(68);	index(69);
		index(70);	index(71);	index(72);	index(73);	index(74);	index(75);	index(76);	index(77);	index(78);	index(79);
		index(80);	index(81);	index(82);	index(83);	index(84);	index(85);	index(86);	index(87);	index(88);	index(89);
		index(90);	index(91);	index(92);	index(93);	index(94);	index(95);	index(96);	index(97);	index(98);	index(99);
		index(100);	index(101);	index(102);	index(103);	index(104);	index(105);	index(106);	index(107);	index(108);	index(109);
		index(110);	index(111);	index(112);	index(113);	index(114);	index(115);	index(116);	index(117);	index(118);	index(119);
		index(120);	index(121);	index(122);	index(123);	index(124);	index(125);	index(126);	index(127);	index(128);	index(129);
		index(130);	index(131);	index(132);	index(133);	index(134);	index(135);	index(136);	index(137);	index(138);	index(139);
		index(140);	index(141);	index(142);	index(143);	index(144);	index(145);	index(146);	index(147);	index(148);	index(149);
		index(150);	index(151);	index(152);	index(153);	index(154);	index(155);	index(156);	index(157);	index(158);	index(159);
		index(160);	index(161);	index(162);	index(163);	index(164);	index(165);	index(166);	index(167);	index(168);	index(169);
		index(170);
	}

#undef index
}